

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O2

QNetworkInterface __thiscall QNativeSocketEngine::multicastInterface(QNativeSocketEngine *this)

{
  long lVar1;
  char cVar2;
  long *in_RSI;
  char *pcVar3;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = in_RSI[1];
  cVar2 = (**(code **)(*in_RSI + 0x78))();
  if (cVar2 == '\0') {
    pcVar3 = 
    "QNativeSocketEngine::multicastInterface() was called on an uninitialized socket device";
  }
  else {
    if (*(int *)(lVar1 + 0x9c) == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QNativeSocketEnginePrivate::nativeMulticastInterface((QNativeSocketEnginePrivate *)this);
        return (QSharedDataPointer<QNetworkInterfacePrivate>)
               (QSharedDataPointer<QNetworkInterfacePrivate>)this;
      }
      goto LAB_001b8c6c;
    }
    pcVar3 = 
    "QNativeSocketEngine::multicastInterface() was called by a socket other than QAbstractSocket::UdpSocket"
    ;
  }
  local_20 = "default";
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0] = '\x02';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  QMessageLogger::warning(local_38,pcVar3);
  QNetworkInterface::QNetworkInterface((QNetworkInterface *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QSharedDataPointer<QNetworkInterfacePrivate>)
           (QSharedDataPointer<QNetworkInterfacePrivate>)this;
  }
LAB_001b8c6c:
  __stack_chk_fail();
}

Assistant:

QNetworkInterface QNativeSocketEngine::multicastInterface() const
{
    Q_D(const QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::multicastInterface(), QNetworkInterface());
    Q_CHECK_TYPE(QNativeSocketEngine::multicastInterface(), QAbstractSocket::UdpSocket, QNetworkInterface());
    return d->nativeMulticastInterface();
}